

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void * sqlite3BtreeSchema(Btree *p,int nBytes,_func_void_void_ptr *xFree)

{
  int *piVar1;
  BtShared *pBVar2;
  void *__s;
  
  pBVar2 = p->pBt;
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  __s = pBVar2->pSchema;
  if (nBytes != 0 && __s == (void *)0x0) {
    __s = sqlite3Malloc((ulong)(uint)nBytes);
    if (__s != (void *)0x0) {
      memset(__s,0,(ulong)(uint)nBytes);
    }
    pBVar2->pSchema = __s;
    pBVar2->xFreeSchema = xFree;
  }
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
      __s = pBVar2->pSchema;
    }
  }
  return __s;
}

Assistant:

SQLITE_PRIVATE void *sqlite3BtreeSchema(Btree *p, int nBytes, void(*xFree)(void *)){
  BtShared *pBt = p->pBt;
  sqlite3BtreeEnter(p);
  if( !pBt->pSchema && nBytes ){
    pBt->pSchema = sqlite3DbMallocZero(0, nBytes);
    pBt->xFreeSchema = xFree;
  }
  sqlite3BtreeLeave(p);
  return pBt->pSchema;
}